

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::NewPlaceholderFile(DescriptorBuilder *this,string *name)

{
  FileDescriptor *__s;
  string *psVar1;
  FileOptions *pFVar2;
  
  __s = (FileDescriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xa0);
  memset(__s,0,0xa0);
  psVar1 = DescriptorPool::Tables::AllocateString(this->tables_,name);
  *(string **)__s = psVar1;
  *(undefined1 **)(__s + 8) = (anonymous_namespace)::kEmptyString_abi_cxx11_;
  *(DescriptorPool **)(__s + 0x10) = this->pool_;
  pFVar2 = FileOptions::default_instance();
  *(FileOptions **)(__s + 0x88) = pFVar2;
  *(undefined1 **)(__s + 0x90) = FileDescriptorTables::kEmpty;
  return __s;
}

Assistant:

const FileDescriptor* DescriptorBuilder::NewPlaceholderFile(
    const string& name) {
  FileDescriptor* placeholder = tables_->Allocate<FileDescriptor>();
  memset(placeholder, 0, sizeof(*placeholder));

  placeholder->name_ = tables_->AllocateString(name);
  placeholder->package_ = &kEmptyString;
  placeholder->pool_ = pool_;
  placeholder->options_ = &FileOptions::default_instance();
  placeholder->tables_ = &FileDescriptorTables::kEmpty;
  // All other fields are zero or NULL.

  return placeholder;
}